

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

Node * __thiscall llvm::FoldingSetBase::GetOrInsertNode(FoldingSetBase *this,Node *N)

{
  Node *E;
  void *IP;
  FoldingSetNodeID ID;
  Node *N_local;
  FoldingSetBase *this_local;
  
  ID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_ = N;
  FoldingSetNodeID::FoldingSetNodeID((FoldingSetNodeID *)&IP);
  (*this->_vptr_FoldingSetBase[1])
            (this,ID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_,&IP);
  this_local = (FoldingSetBase *)FindNodeOrInsertPos(this,(FoldingSetNodeID *)&IP,&E);
  if (this_local == (FoldingSetBase *)0x0) {
    InsertNode(this,(Node *)ID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_,E
              );
    this_local = (FoldingSetBase *)
                 ID.Bits.super_SmallVectorStorage<unsigned_int,_32U>.InlineElts._120_8_;
  }
  FoldingSetNodeID::~FoldingSetNodeID((FoldingSetNodeID *)&IP);
  return (Node *)this_local;
}

Assistant:

FoldingSetBase::Node *FoldingSetBase::GetOrInsertNode(FoldingSetBase::Node *N) {
  FoldingSetNodeID ID;
  GetNodeProfile(N, ID);
  void *IP;
  if (Node *E = FindNodeOrInsertPos(ID, IP))
    return E;
  InsertNode(N, IP);
  return N;
}